

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O0

Point2f __thiscall pbrt::HaltonSampler::Get2D(HaltonSampler *this)

{
  Point2<float> *this_00;
  DigitPermutation *in_RDI;
  undefined1 auVar1 [64];
  int dim;
  float in_stack_ffffffffffffffb8;
  float x;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  float fVar2;
  DigitPermutation *pDVar3;
  int baseIndex;
  Tuple2<pbrt::Point2,_float> local_8;
  undefined1 extraout_var [56];
  
  if (in_RDI[4].nDigits == 0) {
    in_RDI[4].nDigits = in_RDI[4].nDigits + 2;
    auVar1._0_8_ = HaltonPixelIndexer::SampleFirst2D
                             ((HaltonPixelIndexer *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    auVar1._8_56_ = extraout_var;
    local_8 = (Tuple2<pbrt::Point2,_float>)vmovlpd_avx(auVar1._0_16_);
  }
  else {
    if (999 < in_RDI[4].nDigits + 1) {
      in_RDI[4].nDigits = 2;
    }
    x = (float)in_RDI[4].nDigits;
    in_RDI[4].nDigits = in_RDI[4].nDigits + 2;
    fVar2 = x;
    pDVar3 = in_RDI;
    this_00 = (Point2<float> *)HaltonPixelIndexer::SampleIndex((HaltonPixelIndexer *)(in_RDI + 1));
    baseIndex = (int)((ulong)pDVar3 >> 0x20);
    pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
    ::operator[](*(vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
                   **)in_RDI,(long)(int)fVar2);
    ScrambledRadicalInverse(baseIndex,CONCAT44(fVar2,in_stack_ffffffffffffffe8),in_RDI);
    HaltonPixelIndexer::SampleIndex((HaltonPixelIndexer *)(in_RDI + 1));
    pstd::vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
    ::operator[](*(vector<pbrt::DigitPermutation,_pstd::pmr::polymorphic_allocator<pbrt::DigitPermutation>_>
                   **)in_RDI,(long)((int)fVar2 + 1));
    ScrambledRadicalInverse(baseIndex,CONCAT44(fVar2,in_stack_ffffffffffffffe8),in_RDI);
    Point2<float>::Point2(this_00,x,in_stack_ffffffffffffffb8);
  }
  return (Point2f)local_8;
}

Assistant:

PBRT_CPU_GPU
    Point2f Get2D() {
        if (dimension == 0) {
            dimension += 2;
            return haltonPixelIndexer.SampleFirst2D();
        } else {
            if (dimension + 1 >= PrimeTableSize)
                dimension = 2;

            int dim = dimension;
            dimension += 2;
            return {ScrambledRadicalInverse(dim, haltonPixelIndexer.SampleIndex(),
                                            (*digitPermutations)[dim]),
                    ScrambledRadicalInverse(dim + 1, haltonPixelIndexer.SampleIndex(),
                                            (*digitPermutations)[dim + 1])};
        }
    }